

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    if (0 < this->used_digits_) {
      puVar1 = (this->bigits_).start_;
      lVar7 = 0;
      uVar3 = 0;
      do {
        if ((this->bigits_).length_ <= lVar7) goto LAB_0016b20c;
        uVar6 = (ulong)puVar1[lVar7];
        uVar8 = (ulong)((uint)uVar3 & 0xfffffff) + (factor & 0xffffffff) * uVar6;
        puVar1[lVar7] = (uint)uVar8 & 0xfffffff;
        uVar3 = (uVar3 >> 0x1c) + uVar6 * (factor >> 0x1c & 0xfffffffffffffff0) + (uVar8 >> 0x1c);
        lVar7 = lVar7 + 1;
        uVar6 = (ulong)this->used_digits_;
      } while (lVar7 < (long)uVar6);
      if (uVar3 != 0) {
        puVar1 = (this->bigits_).start_;
        do {
          iVar4 = (int)uVar6;
          if (0x7f < iVar4) {
            abort();
          }
          if ((iVar4 < 0) || ((this->bigits_).length_ <= iVar4)) {
LAB_0016b20c:
            __assert_fail("0 <= index && index < length_",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                          ,0xcc,
                          "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                         );
          }
          puVar1[uVar6 & 0xffffffff] = (uint)uVar3 & 0xfffffff;
          uVar5 = this->used_digits_ + 1;
          uVar6 = (ulong)uVar5;
          this->used_digits_ = uVar5;
          bVar2 = 0xfffffff < uVar3;
          uVar3 = uVar3 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(uint64_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  uint64_t low = factor & 0xFFFFFFFF;
  uint64_t high = factor >> 32;
  for (int i = 0; i < used_digits_; ++i) {
    uint64_t product_low = low * bigits_[i];
    uint64_t product_high = high * bigits_[i];
    uint64_t tmp = (carry & kBigitMask) + product_low;
    bigits_[i] = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}